

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell::createTest
          (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x30,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/ExpectedFunctionsListTest.cpp"
                                  ,0x98);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  this_00[5]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002ab498;
  return this_00;
}

Assistant:

TEST(MockExpectedCallsList, removeAllExpectationsExceptThisThatRelateToFirstOne)
{
    call1->withName("relate");
    call2->withName("unrelate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->onlyKeepExpectationsRelatedTo("unrelate");
    LONGS_EQUAL(1, list->size());
}